

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringencode.cc
# Opt level: O3

bool rtc::hex_decode(char ch,uchar *val)

{
  byte bVar1;
  
  bVar1 = ch - 0x30;
  if (9 < bVar1) {
    if ((byte)(ch + 0xbfU) < 0x1a) {
      bVar1 = ch - 0x37;
    }
    else {
      if (0x19 < (byte)(ch + 0x9fU)) {
        return false;
      }
      bVar1 = ch + 0xa9;
    }
  }
  *val = bVar1;
  return true;
}

Assistant:

bool hex_decode(char ch, unsigned char* val) {
  if ((ch >= '0') && (ch <= '9')) {
    *val = ch - '0';
  } else if ((ch >= 'A') && (ch <= 'Z')) {
    *val = (ch - 'A') + 10;
  } else if ((ch >= 'a') && (ch <= 'z')) {
    *val = (ch - 'a') + 10;
  } else {
    return false;
  }
  return true;
}